

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

pattern * featureItem(void)

{
  char local_e8 [8];
  char msg_1 [100];
  char local_78 [8];
  char msg [100];
  pattern *f;
  
  stack0xfffffffffffffff0 = (pattern *)0x0;
  if (lookahead == 0x28) {
    matchTok(0x28);
    register0x00000000 = exprItem();
    matchTok(0x29);
  }
  else if (lookahead == 400) {
    matchTok(400);
    register0x00000000 = featureItem();
    register0x00000000 = makeNode(register0x00000000,(pattern *)0x0,0x12e);
  }
  else if (lookahead == 0x191) {
    register0x00000000 = numericItem(1);
  }
  else if (lookahead == 0x193) {
    register0x00000000 = idItem();
  }
  else if (lookahead == 0x194) {
    register0x00000000 = distItem();
  }
  else if (lookahead == 0x2d) {
    matchTok(0x2d);
    if (lookahead == 0x191) {
      register0x00000000 = numericItem(-1);
    }
    else {
      describeLookahead(local_78,"syntax: minus sign requires a number ");
      errmsg(local_78);
      ParseError = 1;
    }
  }
  else {
    describeLookahead(local_e8,"syntax: improper feature ");
    errmsg(local_e8);
    ParseError = 1;
  }
  return stack0xfffffffffffffff0;
}

Assistant:

pattern* featureItem() {
   pattern *f = NULL;

   if (lookahead == '(') {
      matchTok('(');
      f = exprItem();
      matchTok(')');
   }
   else if (lookahead == NOT_TOK) {
      matchTok(NOT_TOK);
      f = featureItem();
      f = makeNode(f, NULL, NOT_NODE);
   }
   else if (lookahead == NUM_TOK) {
      f = numericItem(+1);
   }
   else if (lookahead == ID_TOK) {
      f = idItem();
   }
   else if (lookahead == WITHIN_TOK) {
      f = distItem();
   }
   /* if an item starts with a minus  */
   /* it is a negative residue number */
   else if (lookahead == '-') {
      matchTok('-');
      if (lookahead == NUM_TOK) {
         f = numericItem(-1);
      }
      else {
         char msg[100];
         describeLookahead(msg,"syntax: minus sign requires a number ");
         errmsg(msg);
         ParseError = TRUE;
      }
   }
   else {
     char msg[100];
     describeLookahead(msg,"syntax: improper feature ");
     errmsg(msg);
     ParseError = TRUE;
   }
   return f;
}